

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

void __thiscall anon_unknown.dwarf_12ebf5d::Helper::Helper(Helper *this,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  string local_48;
  
  this->Status = status;
  this_00 = status->Makefile;
  this->Makefile = this_00;
  (this->DefaultComponentName)._M_dataplus._M_p = (pointer)&(this->DefaultComponentName).field_2;
  (this->DefaultComponentName)._M_string_length = 0;
  (this->DefaultComponentName).field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME","");
  cmMakefile::GetSafeDefinition(this_00,&local_48);
  std::__cxx11::string::_M_assign((string *)&this->DefaultComponentName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((this->DefaultComponentName)._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&this->DefaultComponentName,0,(char *)0x0,0x769e55);
  }
  return;
}

Assistant:

Helper(cmExecutionStatus& status)
    : Status(status)
    , Makefile(&status.GetMakefile())
  {
    this->DefaultComponentName = this->Makefile->GetSafeDefinition(
      "CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
    if (this->DefaultComponentName.empty()) {
      this->DefaultComponentName = "Unspecified";
    }
  }